

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_combo_begin_color(nk_context *ctx,nk_color color,nk_vec2 size)

{
  nk_command_buffer *b;
  nk_vec2 nVar1;
  nk_window *win;
  nk_rect r;
  nk_rect rect;
  nk_rect header_00;
  nk_widget_layout_states nVar2;
  int iVar3;
  long lVar4;
  nk_context *i;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar5;
  float fVar6;
  nk_rect r_00;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect header;
  nk_rect local_a0;
  uint local_90;
  nk_color local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  nk_rect local_78;
  undefined1 local_68 [16];
  nk_rect local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5f8e,
                  "int nk_combo_begin_color(struct nk_context *, struct nk_color, struct nk_vec2)");
  }
  win = ctx->current;
  if (win != (nk_window *)0x0) {
    local_68._8_4_ = in_XMM0_Dc;
    local_68._0_8_ = size;
    local_68._12_4_ = in_XMM0_Dd;
    if (win->layout != (nk_panel *)0x0) {
      nVar2 = nk_widget(&local_a0,ctx);
      if (nVar2 == NK_WIDGET_INVALID) {
        iVar3 = 0;
      }
      else {
        i = ctx;
        if ((win->layout->flags & 0x1000) != 0) {
          i = (nk_context *)0x0;
        }
        if (nVar2 == NK_WIDGET_ROM) {
          i = (nk_context *)0x0;
        }
        local_88 = CONCAT44(local_a0.h,local_a0.w);
        r.w = local_a0.w;
        r.x = local_a0.x;
        r.y = local_a0.y;
        r.h = local_a0.h;
        local_78.x = local_a0.x;
        local_78.y = local_a0.y;
        local_78.w = 0.0;
        local_78.h = 0.0;
        uStack_80 = 0;
        iVar3 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
        lVar4 = 0x1af0;
        if ((ctx->last_widget_state & 0x20) == 0) {
          lVar4 = (ulong)(ctx->last_widget_state & 0x10) * 2 + 0x1ab0;
        }
        b = &win->buffer;
        local_90 = (uint)(iVar3 != 0);
        local_8c = color;
        if (*(int *)((long)&(ctx->input).keyboard.keys[0].down + lVar4) == 1) {
          r_00.w = (float)(nk_symbol_type)local_88;
          r_00.h = (float)local_88._4_4_;
          r_00.x = local_78.x;
          r_00.y = local_78.y;
          nk_draw_image(b,r_00,(nk_image *)((long)&(ctx->input).keyboard.keys[1].down + lVar4),
                        (nk_color)0xffffffff);
        }
        else {
          rect_00.w = (float)(nk_symbol_type)local_88;
          rect_00.h = (float)local_88._4_4_;
          rect_00.x = local_78.x;
          rect_00.y = local_78.y;
          nk_fill_rect(b,rect_00,(ctx->style).combo.rounding,
                       *(nk_color *)((long)&(ctx->input).keyboard.keys[1].down + lVar4));
          rect.w = local_a0.w;
          rect.x = local_a0.x;
          rect.y = local_a0.y;
          rect.h = local_a0.h;
          nk_stroke_rect(b,rect,(ctx->style).combo.rounding,(ctx->style).combo.border,
                         (ctx->style).combo.border_color);
        }
        lVar4 = 0x1be4;
        if ((ctx->last_widget_state & 0x10) == 0) {
          lVar4 = (ulong)(iVar3 != 0) * 8 + 0x1be0;
        }
        local_88 = CONCAT44(local_88._4_4_,
                            *(undefined4 *)((long)&(ctx->input).keyboard.keys[0].down + lVar4));
        local_50.y = (ctx->style).combo.button_padding.y;
        local_50.w = local_a0.h - (local_50.y + local_50.y);
        local_50.x = ((local_a0.w + local_a0.x) - local_a0.h) - (ctx->style).combo.button_padding.x;
        local_50.y = local_a0.y + local_50.y;
        nVar1 = (ctx->style).combo.button.padding;
        fVar5 = nVar1.x;
        local_40.y = nVar1.y;
        local_40.x = local_50.x + fVar5;
        local_40.w = local_50.w - (fVar5 + fVar5);
        local_40.h = local_50.w - (local_40.y + local_40.y);
        local_40.y = local_50.y + local_40.y;
        nVar1 = (ctx->style).combo.content_padding;
        fVar5 = nVar1.x;
        fVar6 = nVar1.y;
        rect_01.x = fVar5 + fVar5 + local_a0.x;
        rect_01.y = fVar6 + fVar6 + local_a0.y;
        rect_01.w = (local_50.x - (fVar5 + (ctx->style).combo.spacing.x)) - rect_01.x;
        rect_01.h = fVar6 * -4.0 + local_a0.h;
        local_50.h = local_50.w;
        nk_fill_rect(b,rect_01,0.0,local_8c);
        nk_draw_button_symbol
                  (b,&local_50,&local_40,ctx->last_widget_state,&(ctx->style).combo.button,
                   (nk_symbol_type)local_88,(ctx->style).font);
        header_00.w = local_a0.w;
        header_00.x = local_a0.x;
        header_00.y = local_a0.y;
        header_00.h = local_a0.h;
        iVar3 = nk_combo_begin(ctx,win,(nk_vec2)local_68._0_8_,local_90,header_00);
      }
      return iVar3;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5f90,
                  "int nk_combo_begin_color(struct nk_context *, struct nk_color, struct nk_vec2)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x5f8f,
                "int nk_combo_begin_color(struct nk_context *, struct nk_color, struct nk_vec2)");
}

Assistant:

NK_API int
nk_combo_begin_color(struct nk_context *ctx, struct nk_color color, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_style *style;
    const struct nk_input *in;

    struct nk_rect header;
    int is_clicked = nk_false;
    enum nk_widget_layout_states s;
    const struct nk_style_item *background;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (s == NK_WIDGET_INVALID)
        return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED)
        background = &style->combo.active;
    else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
        background = &style->combo.hover;
    else background = &style->combo.normal;

    if (background->type == NK_STYLE_ITEM_IMAGE) {
        nk_draw_image(&win->buffer, header, &background->data.image,nk_white);
    } else {
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        struct nk_rect content;
        struct nk_rect button;
        struct nk_rect bounds;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;

        /* draw color */
        bounds.h = header.h - 4 * style->combo.content_padding.y;
        bounds.y = header.y + 2 * style->combo.content_padding.y;
        bounds.x = header.x + 2 * style->combo.content_padding.x;
        bounds.w = (button.x - (style->combo.content_padding.x + style->combo.spacing.x)) - bounds.x;
        nk_fill_rect(&win->buffer, bounds, 0, color);

        /* draw open/close button */
        nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}